

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O0

reverse_iterator * __thiscall llvm::sys::path::reverse_iterator::operator++(reverse_iterator *this)

{
  char cVar1;
  bool bVar2;
  size_t sVar3;
  size_t sVar4;
  StringRef str;
  StringRef SVar5;
  bool local_79;
  char *local_70;
  size_t local_68;
  anon_unknown_dwarf_3697931 *local_60;
  size_t local_58;
  size_t start_pos;
  size_t local_40;
  size_t local_38;
  size_t end_pos;
  size_t local_28;
  size_t local_20;
  size_t root_dir_pos;
  reverse_iterator *this_local;
  
  end_pos = (size_t)(this->Path).Data;
  local_28 = (this->Path).Length;
  SVar5.Length._0_4_ = this->S;
  SVar5.Data = (char *)local_28;
  SVar5.Length._4_4_ = 0;
  root_dir_pos = (size_t)this;
  local_20 = anon_unknown.dwarf_3697931::root_dir_start
                       ((anon_unknown_dwarf_3697931 *)end_pos,SVar5,(Style)local_28);
  local_38 = this->Position;
  while( true ) {
    local_79 = false;
    if ((local_38 != 0) && (local_79 = false, local_38 - 1 != local_20)) {
      cVar1 = StringRef::operator[](&this->Path,local_38 - 1);
      local_79 = is_separator(cVar1,this->S);
    }
    if (local_79 == false) break;
    local_38 = local_38 - 1;
  }
  sVar4 = this->Position;
  sVar3 = StringRef::size(&this->Path);
  if ((sVar4 == sVar3) && (bVar2 = StringRef::empty(&this->Path), !bVar2)) {
    cVar1 = StringRef::back(&this->Path);
    bVar2 = is_separator(cVar1,this->S);
    if ((bVar2) && ((local_20 == 0xffffffffffffffff || (local_20 < local_38 - 1)))) {
      this->Position = this->Position - 1;
      StringRef::StringRef((StringRef *)&start_pos,".");
      (this->Component).Data = (char *)start_pos;
      (this->Component).Length = local_40;
      return this;
    }
  }
  SVar5 = StringRef::substr(&this->Path,0,local_38);
  local_60 = (anon_unknown_dwarf_3697931 *)SVar5.Data;
  local_58 = SVar5.Length;
  str.Length._0_4_ = this->S;
  str.Data = (char *)local_58;
  str.Length._4_4_ = 0;
  sVar4 = anon_unknown.dwarf_3697931::filename_pos(local_60,str,(Style)SVar5.Data);
  SVar5 = StringRef::slice(&this->Path,sVar4,local_38);
  local_70 = SVar5.Data;
  (this->Component).Data = local_70;
  local_68 = SVar5.Length;
  (this->Component).Length = local_68;
  this->Position = sVar4;
  return this;
}

Assistant:

reverse_iterator &reverse_iterator::operator++() {
  size_t root_dir_pos = root_dir_start(Path, S);

  // Skip separators unless it's the root directory.
  size_t end_pos = Position;
  while (end_pos > 0 && (end_pos - 1) != root_dir_pos &&
         is_separator(Path[end_pos - 1], S))
    --end_pos;

  // Treat trailing '/' as a '.', unless it is the root dir.
  if (Position == Path.size() && !Path.empty() &&
      is_separator(Path.back(), S) &&
      (root_dir_pos == StringRef::npos || end_pos - 1 > root_dir_pos)) {
    --Position;
    Component = ".";
    return *this;
  }

  // Find next separator.
  size_t start_pos = filename_pos(Path.substr(0, end_pos), S);
  Component = Path.slice(start_pos, end_pos);
  Position = start_pos;
  return *this;
}